

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::Picker(Picker *this,QWidget *parent,WindowFlags f)

{
  PickerPrivate *pPVar1;
  PickerPrivate *this_00;
  Object local_40;
  Int local_24;
  QWidget *local_20;
  QWidget *parent_local;
  Picker *this_local;
  WindowFlags f_local;
  
  local_24 = f.i;
  local_20 = parent;
  parent_local = &this->super_QWidget;
  this_local._4_4_ = f.i;
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)f.i);
  *(undefined ***)this = &PTR_metaObject_00241490;
  *(undefined ***)&this->field_0x10 = &PTR__Picker_00241640;
  pPVar1 = (PickerPrivate *)operator_new(0x88);
  PickerPrivate::PickerPrivate(pPVar1,this);
  QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
  QScopedPointer(&this->d,pPVar1);
  this_00 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
            ::operator->(&this->d);
  PickerPrivate::init(this_00,(EVP_PKEY_CTX *)pPVar1);
  pPVar1 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  QObject::connect<void(QtMWidgets::Scroller::*)(int,int),void(QtMWidgets::Picker::*)(int,int)>
            (&local_40,(offset_in_Scroller_to_subr)pPVar1->scroller,(Object *)Scroller::scroll,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)&local_40);
  return;
}

Assistant:

Picker::Picker( QWidget * parent, Qt::WindowFlags f )
	:	QWidget( parent, f )
	,	d( new PickerPrivate( this ) )
{
	d->init();

	connect( d->scroller, &Scroller::scroll,
		this, &Picker::_q_scroll );
}